

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void extend_mc_border(scale_factors *sf,buf_2d *pre_buf,MV32 scaled_mv,PadBlock block,
                     int subpel_x_mv,int subpel_y_mv,int do_warp,int is_intrabc,int highbd,
                     uint8_t *mc_buf,uint8_t **pre,int *src_stride)

{
  MV32 scaled_mv_00;
  int iVar1;
  long lVar2;
  int *in_RCX;
  int in_EDX;
  int unaff_EBX;
  uint8_t *in_RSI;
  int in_EDI;
  int *in_R8;
  int in_R9D;
  int in_stack_00000020;
  int b_h;
  int b_w;
  int buf_stride;
  uint8_t *buf_ptr;
  int *in_stack_00000038;
  int y_pad;
  int x_pad;
  PadBlock *block_00;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int32_t in_stack_ffffffffffffffbc;
  int src_stride_00;
  int32_t in_stack_ffffffffffffffc0;
  int iVar3;
  int local_38;
  int w;
  int h;
  
  local_38 = 0;
  iVar3 = 0;
  block_00 = (PadBlock *)&stack0xffffffffffffffc4;
  scaled_mv_00.col = in_stack_ffffffffffffffc0;
  scaled_mv_00.row = in_stack_ffffffffffffffbc;
  iVar1 = update_extend_mc_border_params
                    ((scale_factors *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (buf_2d *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     scaled_mv_00,block_00,(int)((ulong)&local_38 >> 0x20),(int)&local_38,
                     (int)in_RSI,in_EDI,in_RCX,in_R8);
  if (iVar1 != 0) {
    h = (int)in_R8;
    w = (int)in_RCX;
    lVar2 = *(long *)(in_RSI + 8) + (long)(h * *(int *)(in_RSI + 0x18)) + (long)w;
    src_stride_00 = (int)((ulong)lVar2 >> 0x20);
    iVar1 = (int)((ulong)in_RCX >> 0x20) - w;
    if (in_stack_00000020 == 0) {
      build_mc_border((uint8_t *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),src_stride_00,
                      (uint8_t *)CONCAT44(*(int *)(in_RSI + 0x18),iVar1),
                      (int)((ulong)in_R8 >> 0x20) - h,in_stack_ffffffffffffffa8,
                      (int)((ulong)block_00 >> 0x20),(int)in_RSI,in_EDI,w,h);
    }
    else {
      highbd_build_mc_border
                (in_RSI,in_R9D,(uint8_t *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),src_stride_00,
                 (int)lVar2,*(int *)(in_RSI + 0x18),w,h,in_EDX,unaff_EBX);
    }
    *in_stack_00000038 = iVar1;
    *(long *)buf_ptr = _b_w + iVar3 * 3 * iVar1 + (long)(local_38 * 3);
  }
  return;
}

Assistant:

static inline void extend_mc_border(const struct scale_factors *const sf,
                                    struct buf_2d *const pre_buf,
                                    MV32 scaled_mv, PadBlock block,
                                    int subpel_x_mv, int subpel_y_mv,
                                    int do_warp, int is_intrabc, int highbd,
                                    uint8_t *mc_buf, uint8_t **pre,
                                    int *src_stride) {
  int x_pad = 0, y_pad = 0;
  if (update_extend_mc_border_params(sf, pre_buf, scaled_mv, &block,
                                     subpel_x_mv, subpel_y_mv, do_warp,
                                     is_intrabc, &x_pad, &y_pad)) {
    // Get reference block pointer.
    const uint8_t *const buf_ptr =
        pre_buf->buf0 + block.y0 * pre_buf->stride + block.x0;
    int buf_stride = pre_buf->stride;
    const int b_w = block.x1 - block.x0;
    const int b_h = block.y1 - block.y0;

#if CONFIG_AV1_HIGHBITDEPTH
    // Extend the border.
    if (highbd) {
      highbd_build_mc_border(buf_ptr, buf_stride, mc_buf, b_w, block.x0,
                             block.y0, b_w, b_h, pre_buf->width,
                             pre_buf->height);
    } else {
      build_mc_border(buf_ptr, buf_stride, mc_buf, b_w, block.x0, block.y0, b_w,
                      b_h, pre_buf->width, pre_buf->height);
    }
#else
    (void)highbd;
    build_mc_border(buf_ptr, buf_stride, mc_buf, b_w, block.x0, block.y0, b_w,
                    b_h, pre_buf->width, pre_buf->height);
#endif
    *src_stride = b_w;
    *pre = mc_buf + y_pad * (AOM_INTERP_EXTEND - 1) * b_w +
           x_pad * (AOM_INTERP_EXTEND - 1);
  }
}